

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall cmFileCopier::CheckValue(cmFileCopier *this,string *arg)

{
  cmCommand *pcVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  reference pMVar5;
  ostream *poVar6;
  string local_620;
  ostringstream local_600 [8];
  ostringstream e_1;
  __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
  local_488;
  __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
  local_480;
  MatchRule local_478;
  string local_380;
  undefined1 local_360 [8];
  ostringstream e;
  __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
  local_1e8;
  __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
  local_1e0;
  MatchRule local_1d8;
  string local_e0;
  allocator local_b9;
  undefined1 local_b8 [8];
  string regex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator local_41;
  undefined1 local_40 [8];
  string file;
  string *arg_local;
  cmFileCopier *this_local;
  
  file.field_2._8_8_ = arg;
  switch(this->Doing) {
  case 2:
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar4);
      if (bVar2) goto LAB_0069174f;
      pcVar4 = cmMakefile::GetCurrentBinaryDirectory(this->Makefile);
      std::__cxx11::string::operator=((string *)&this->Destination,pcVar4);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (regex.field_2._M_local_buf + 8),"/",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     file.field_2._8_8_);
      std::__cxx11::string::operator+=
                ((string *)&this->Destination,(string *)(regex.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(regex.field_2._M_local_buf + 8));
    }
    else {
LAB_0069174f:
      std::__cxx11::string::operator=((string *)&this->Destination,(string *)file.field_2._8_8_);
    }
    this->Doing = 0;
    break;
  case 3:
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar4);
      if (!bVar2) {
        pcVar4 = cmMakefile::GetCurrentSourceDirectory(this->Makefile);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_40,pcVar4,&local_41);
        std::allocator<char>::~allocator((allocator<char> *)&local_41);
        std::operator+(&local_78,"/",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       file.field_2._8_8_);
        std::__cxx11::string::operator+=((string *)local_40,(string *)&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->Files,(value_type *)local_40);
        std::__cxx11::string::~string((string *)local_40);
        return true;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Files,(value_type *)file.field_2._8_8_);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_b8,"/",&local_b9);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    cmsys::Glob::PatternToRegex(&local_e0,(string *)file.field_2._8_8_,false,false);
    std::__cxx11::string::operator+=((string *)local_b8,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::operator+=((string *)local_b8,"$");
    MatchRule::MatchRule(&local_1d8,(string *)local_b8);
    std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>::push_back
              (&this->MatchRules,&local_1d8);
    MatchRule::~MatchRule(&local_1d8);
    local_1e8._M_current =
         (MatchRule *)
         std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>::end
                   (&this->MatchRules);
    local_1e0 = __gnu_cxx::
                __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
                ::operator-(&local_1e8,1);
    pMVar5 = __gnu_cxx::
             __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
             ::operator*(&local_1e0);
    this->CurrentMatchRule = pMVar5;
    bVar2 = cmsys::RegularExpression::is_valid(&this->CurrentMatchRule->Regex);
    if (bVar2) {
      this->Doing = 0;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_360);
      poVar6 = std::operator<<((ostream *)local_360,"could not compile PATTERN \"");
      poVar6 = std::operator<<(poVar6,(string *)file.field_2._8_8_);
      std::operator<<(poVar6,"\".");
      pcVar1 = &this->FileCommand->super_cmCommand;
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(pcVar1,&local_380);
      std::__cxx11::string::~string((string *)&local_380);
      this->Doing = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_360);
    }
    std::__cxx11::string::~string((string *)local_b8);
    break;
  case 5:
    MatchRule::MatchRule(&local_478,arg);
    std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>::push_back
              (&this->MatchRules,&local_478);
    MatchRule::~MatchRule(&local_478);
    local_488._M_current =
         (MatchRule *)
         std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>::end
                   (&this->MatchRules);
    local_480 = __gnu_cxx::
                __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
                ::operator-(&local_488,1);
    pMVar5 = __gnu_cxx::
             __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
             ::operator*(&local_480);
    this->CurrentMatchRule = pMVar5;
    bVar2 = cmsys::RegularExpression::is_valid(&this->CurrentMatchRule->Regex);
    if (bVar2) {
      this->Doing = 0;
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_600);
      poVar6 = std::operator<<((ostream *)local_600,"could not compile REGEX \"");
      poVar6 = std::operator<<(poVar6,(string *)file.field_2._8_8_);
      std::operator<<(poVar6,"\".");
      pcVar1 = &this->FileCommand->super_cmCommand;
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(pcVar1,&local_620);
      std::__cxx11::string::~string((string *)&local_620);
      this->Doing = 1;
      std::__cxx11::ostringstream::~ostringstream(local_600);
    }
    break;
  case 6:
    bVar2 = CheckPermissions(this,arg,&this->FilePermissions);
    if (!bVar2) {
      this->Doing = 1;
    }
    break;
  case 7:
    bVar2 = CheckPermissions(this,arg,&this->DirPermissions);
    if (!bVar2) {
      this->Doing = 1;
    }
    break;
  case 8:
    bVar2 = CheckPermissions(this,arg,&(this->CurrentMatchRule->Properties).Permissions);
    if (!bVar2) {
      this->Doing = 1;
    }
    break;
  default:
    return false;
  }
  return true;
}

Assistant:

bool cmFileCopier::CheckValue(std::string const& arg)
{
  switch(this->Doing)
    {
    case DoingFiles:
      if(arg.empty() || cmSystemTools::FileIsFullPath(arg.c_str()))
        {
        this->Files.push_back(arg);
        }
      else
        {
        std::string file = this->Makefile->GetCurrentSourceDirectory();
        file += "/" + arg;
        this->Files.push_back(file);
        }
      break;
    case DoingDestination:
      if(arg.empty() || cmSystemTools::FileIsFullPath(arg.c_str()))
        {
        this->Destination = arg;
        }
      else
        {
        this->Destination = this->Makefile->GetCurrentBinaryDirectory();
        this->Destination += "/" + arg;
        }
      this->Doing = DoingNone;
      break;
    case DoingPattern:
      {
      // Convert the pattern to a regular expression.  Require a
      // leading slash and trailing end-of-string in the matched
      // string to make sure the pattern matches only whole file
      // names.
      std::string regex = "/";
      regex += cmsys::Glob::PatternToRegex(arg, false);
      regex += "$";
      this->MatchRules.push_back(MatchRule(regex));
      this->CurrentMatchRule = &*(this->MatchRules.end()-1);
      if(this->CurrentMatchRule->Regex.is_valid())
        {
        this->Doing = DoingNone;
        }
      else
        {
        std::ostringstream e;
        e << "could not compile PATTERN \"" << arg << "\".";
        this->FileCommand->SetError(e.str());
        this->Doing = DoingError;
        }
      }
      break;
    case DoingRegex:
      this->MatchRules.push_back(MatchRule(arg));
      this->CurrentMatchRule = &*(this->MatchRules.end()-1);
      if(this->CurrentMatchRule->Regex.is_valid())
        {
        this->Doing = DoingNone;
        }
      else
        {
        std::ostringstream e;
        e << "could not compile REGEX \"" << arg << "\".";
        this->FileCommand->SetError(e.str());
        this->Doing = DoingError;
        }
      break;
    case DoingPermissionsFile:
      if(!this->CheckPermissions(arg, this->FilePermissions))
        {
        this->Doing = DoingError;
        }
      break;
    case DoingPermissionsDir:
      if(!this->CheckPermissions(arg, this->DirPermissions))
        {
        this->Doing = DoingError;
        }
      break;
    case DoingPermissionsMatch:
      if(!this->CheckPermissions(
           arg, this->CurrentMatchRule->Properties.Permissions))
        {
        this->Doing = DoingError;
        }
      break;
    default:
      return false;
    }
  return true;
}